

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

int __thiscall
CVmObjLookupTable::getp_apply_all
          (CVmObjLookupTable *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_val_t *funcptr;
  uint *puVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  vm_datatype_t *pvVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  int iVar6;
  uint uVar7;
  CVmRun *this_00;
  vm_lookup_val *entry;
  bool bVar8;
  vm_rcdesc rc;
  
  if (getp_apply_all(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    iVar6 = __cxa_guard_acquire(&getp_apply_all(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    if (iVar6 != 0) {
      getp_apply_all::desc.min_argc_ = 1;
      getp_apply_all::desc.opt_argc_ = 0;
      getp_apply_all::desc.varargs_ = 0;
      __cxa_guard_release(&getp_apply_all(unsigned_int,vm_val_t*,unsigned_int*)::desc);
    }
  }
  vm_rcdesc::vm_rcdesc(&rc,"LookupTable.applyAll",self,3,sp_ + -1,argc);
  iVar6 = CVmObject::get_prop_check_argc(retval,argc,&getp_apply_all::desc);
  pvVar5 = sp_;
  if (iVar6 == 0) {
    funcptr = sp_ + -1;
    pvVar3 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar3 = VM_OBJ;
    (pvVar5->val).obj = self;
    puVar1 = (uint *)(this->super_CVmObjCollection).super_CVmObject.ext_;
    uVar7 = puVar1[1];
    entry = (vm_lookup_val *)(puVar1 + (ulong)*puVar1 * 2 + 8);
    while (pvVar5 = sp_, bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
      if ((entry->key).typ != VM_EMPTY) {
        uVar4 = *(undefined4 *)&(entry->val).field_0x4;
        aVar2 = (entry->val).val;
        sp_ = sp_ + 1;
        pvVar5->typ = (entry->val).typ;
        *(undefined4 *)&pvVar5->field_0x4 = uVar4;
        pvVar5->val = aVar2;
        pvVar5 = sp_;
        uVar4 = *(undefined4 *)&(entry->key).field_0x4;
        aVar2 = (entry->key).val;
        sp_ = sp_ + 1;
        pvVar5->typ = (entry->key).typ;
        *(undefined4 *)&pvVar5->field_0x4 = uVar4;
        pvVar5->val = aVar2;
        this_00 = &G_interpreter_X;
        CVmRun::call_func_ptr(&G_interpreter_X,funcptr,2,&rc,0);
        set_entry_val_undo((CVmObjLookupTable *)this_00,self,entry,&r0_);
      }
      entry = entry + 1;
    }
    sp_ = sp_ + -2;
    retval->typ = VM_NIL;
  }
  return 1;
}

Assistant:

int CVmObjLookupTable::getp_apply_all(VMG_ vm_obj_id_t self,
                                      vm_val_t *retval, uint *argc)
{
    vm_val_t *fn;
    vm_lookup_val *entry;
    static CVmNativeCodeDesc desc(1);
    uint i;
    vm_rcdesc rc(vmg_ "LookupTable.applyAll", self, 3, G_stk->get(0), argc);
    
    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* the function to invoke is the top argument */
    fn = G_stk->get(0);

    /* push a self-reference for gc protection */
    G_stk->push()->set_obj(self);

    /* iterate over each entry */
    for (i = get_entry_count(), entry = get_ext()->idx_to_val(0) ;
         i != 0 ; ++entry, --i)
    {
        /* 
         *   if the entry is in use (it is if the key is non-empty), invoke
         *   the callback on it 
         */
        if (entry->key.typ != VM_EMPTY)
        {
            /* push the arguments - (key, val) - push in reverse order */
            G_stk->push(&entry->val);
            G_stk->push(&entry->key);
            
            /* invoke the callback */
            G_interpreter->call_func_ptr(vmg_ fn, 2, &rc, 0);
            
            /* replace this element with the result */
            set_entry_val_undo(vmg_ self, entry, G_interpreter->get_r0());
        }
    }

    /* discard the arguments and gc protection */
    G_stk->discard(2);

    /* no return value */
    retval->set_nil();

    /* handled */
    return TRUE;
}